

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode Curl_GetFTPResponse(ssize_t *nreadp,connectdata *conn,int *ftpcode)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  curl_socket_t readfd0;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  time_t timeout_ms;
  long lVar4;
  uint *puVar5;
  int value_to_be_ignored;
  size_t nread;
  int local_50;
  int local_4c;
  Curl_easy *local_48;
  long *local_40;
  size_t local_38;
  
  readfd0 = conn->sock[0];
  local_4c = 0;
  local_48 = conn->data;
  if (ftpcode == (int *)0x0) {
    ftpcode = &local_4c;
  }
  else {
    *ftpcode = 0;
  }
  pp = &conn->proto;
  lVar4 = 0;
  local_50 = 0;
  local_40 = nreadp;
LAB_00115484:
  *local_40 = lVar4;
  while (*ftpcode == 0) {
    timeout_ms = Curl_pp_state_timeout(&(pp->ftpc).pp);
    if (timeout_ms < 1) {
      Curl_failf(local_48,"FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (999 < timeout_ms) {
      timeout_ms = 1000;
    }
    if ((((pp->ftpc).pp.cache != (char *)0x0) && (local_50 < 2)) ||
       (_Var1 = Curl_conn_data_pending(conn,0), _Var1)) goto LAB_001154f6;
    iVar2 = Curl_socket_check(readfd0,-1,-1,timeout_ms);
    if (iVar2 != 0) goto LAB_001154f1;
    iVar2 = Curl_pgrsUpdate(conn);
    if (iVar2 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  CVar3 = CURLE_OK;
LAB_00115540:
  (conn->proto).sshc.authed = false;
  return CVar3;
LAB_001154f1:
  if (iVar2 == -1) {
    puVar5 = (uint *)__errno_location();
    Curl_failf(local_48,"FTP response aborted due to select/poll error: %d",(ulong)*puVar5);
    return CURLE_RECV_ERROR;
  }
LAB_001154f6:
  CVar3 = ftp_readresp(readfd0,&(pp->ftpc).pp,ftpcode,&local_38);
  if (CVar3 != CURLE_OK) goto LAB_00115540;
  iVar2 = 0;
  if (local_38 == 0) {
    iVar2 = local_50 + 1;
    if ((pp->ftpc).pp.cache == (char *)0x0) {
      iVar2 = 0;
    }
  }
  lVar4 = local_38 + *local_40;
  local_50 = iVar2;
  goto LAB_00115484;
}

Assistant:

CURLcode Curl_GetFTPResponse(ssize_t *nreadp, /* return number of bytes read */
                             struct connectdata *conn,
                             int *ftpcode) /* return the ftp-code */
{
  /*
   * We cannot read just one byte per read() and then go back to select() as
   * the OpenSSL read() doesn't grok that properly.
   *
   * Alas, read as much as possible, split up into lines, use the ending
   * line in a response or continue reading.  */

  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  time_t timeout;              /* timeout in milliseconds */
  time_t interval_ms;
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  size_t nread;
  int cache_skip = 0;
  int value_to_be_ignored = 0;

  if(ftpcode)
    *ftpcode = 0; /* 0 for errors */
  else
    /* make the pointer point to something for the rest of this function */
    ftpcode = &value_to_be_ignored;

  *nreadp = 0;

  while(!*ftpcode && !result) {
    /* check and reset timeout value every lap */
    timeout = Curl_pp_state_timeout(pp);

    if(timeout <= 0) {
      failf(data, "FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT; /* already too little time */
    }

    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout < interval_ms)
      interval_ms = timeout;

    /*
     * Since this function is blocking, we need to wait here for input on the
     * connection and only then we call the response reading function. We do
     * timeout at least every second to make the timeout check run.
     *
     * A caution here is that the ftp_readresp() function has a cache that may
     * contain pieces of a response from the previous invoke and we need to
     * make sure we don't just wait for input while there is unhandled data in
     * that cache. But also, if the cache is there, we call ftp_readresp() and
     * the cache wasn't good enough to continue we must not just busy-loop
     * around this function.
     *
     */

    if(pp->cache && (cache_skip < 2)) {
      /*
       * There's a cache left since before. We then skipping the wait for
       * socket action, unless this is the same cache like the previous round
       * as then the cache was deemed not enough to act on and we then need to
       * wait for more data anyway.
       */
    }
    else if(!Curl_conn_data_pending(conn, FIRSTSOCKET)) {
      switch(SOCKET_READABLE(sockfd, interval_ms)) {
      case -1: /* select() error, stop reading */
        failf(data, "FTP response aborted due to select/poll error: %d",
              SOCKERRNO);
        return CURLE_RECV_ERROR;

      case 0: /* timeout */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
        continue; /* just continue in our loop for the timeout duration */

      default: /* for clarity */
        break;
      }
    }
    result = ftp_readresp(sockfd, pp, ftpcode, &nread);
    if(result)
      break;

    if(!nread && pp->cache)
      /* bump cache skip counter as on repeated skips we must wait for more
         data */
      cache_skip++;
    else
      /* when we got data or there is no cache left, we reset the cache skip
         counter */
      cache_skip = 0;

    *nreadp += nread;

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}